

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.cpp
# Opt level: O3

void test_simple_ggx_fit(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  vec3 view_dir;
  undefined4 uVar2;
  ostream *poVar3;
  ltc_store_data data;
  ggx ggx;
  brdf_plot plot;
  ltc ltc;
  string local_190;
  anon_union_12_3_e2189aaa_for_vec<3,_float,_(glm::precision)0>_3 local_170;
  ltc_store_data local_164;
  brdf local_148;
  undefined4 local_140;
  undefined1 local_138 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_128 [7];
  anon_union_12_3_e2189aaa_for_vec<3,_float,_(glm::precision)0>_3 local_b0;
  anon_union_12_3_e2189aaa_for_vec<3,_float,_(glm::precision)0>_3 local_a0;
  undefined1 local_90 [128];
  
  poVar3 = log_info();
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,"VISUAL TEST: test_simple_ggx_fit started.",0x29);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  local_148._vptr_brdf = (_func_int **)&PTR__brdf_001c98b0;
  local_140 = 0x3e19999a;
  local_170._0_8_ = 0;
  local_170.field_0.z = 1.0;
  calculate_average_terms((ltc_average_terms *)local_138,&local_148,(vec3 *)&local_170.field_0,0x20)
  ;
  uVar2 = (undefined4)local_128[0]._M_allocated_capacity;
  poVar3 = log_info();
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," average direction: ",0x14);
  glm::detail::format_abi_cxx11_((string *)local_138,"%svec3(%s, %s, %s)","","%f","%f","%f");
  glm::detail::format_abi_cxx11_
            ((string *)local_90,(char *)local_138._0_8_,(double)(float)local_138._8_4_,
             (double)(float)local_138._12_4_,(double)(float)uVar2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._0_8_ != local_128) {
    operator_delete((void *)local_138._0_8_,
                    CONCAT44(local_128[0]._M_allocated_capacity._4_4_,
                             (undefined4)local_128[0]._M_allocated_capacity) + 1);
  }
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,(char *)local_90._0_8_,local_90._8_8_);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  if ((undefined1 *)local_90._0_8_ != local_90 + 0x10) {
    operator_delete((void *)local_90._0_8_,local_90._16_8_ + 1);
  }
  local_a0._0_8_ = 0x3f8000003f800000;
  local_a0.field_0.z = 0.0;
  local_b0._0_8_ = 0;
  local_b0.field_0.z = 0.0;
  view_dir.field_0.field_0.z = local_170.field_0.z;
  view_dir.field_0._0_8_ = local_170._0_8_;
  ltc_fit(&local_164,&local_148,view_dir,true,(vec3 *)&local_a0.field_0,(vec3 *)&local_b0.field_0);
  poVar3 = log_info();
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"Store data:",0xb);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  poVar3 = log_info();
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," a=",3);
  poVar3 = std::ostream::_M_insert<double>((double)local_164.matrix_parameters._M_elems[0]);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  poVar3 = log_info();
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," b=",3);
  poVar3 = std::ostream::_M_insert<double>((double)local_164.matrix_parameters._M_elems[1]);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  poVar3 = log_info();
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," c=",3);
  poVar3 = std::ostream::_M_insert<double>((double)local_164.matrix_parameters._M_elems[2]);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  poVar3 = log_info();
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," d=",3);
  poVar3 = std::ostream::_M_insert<double>((double)local_164.matrix_parameters._M_elems[3]);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  poVar3 = log_info();
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," e=",3);
  poVar3 = std::ostream::_M_insert<double>((double)local_164.matrix_parameters._M_elems[4]);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  poVar3 = log_info();
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," fresnel=",9);
  poVar3 = std::ostream::_M_insert<double>((double)local_164.fresnel_term);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  poVar3 = log_info();
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," magnitude=",0xb);
  poVar3 = std::ostream::_M_insert<double>((double)local_164.distribution_norm);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  ::ltc::ltc((ltc *)local_90);
  ::ltc::set_store_data((ltc *)local_90,&local_164);
  brdf_plot::brdf_plot((brdf_plot *)local_138);
  brdf_plot::set_view_dir((brdf_plot *)local_138,(vec3 *)&local_170.field_0);
  brdf_plot::set_resolution((brdf_plot *)local_138,0x200);
  paVar1 = &local_190.field_2;
  local_190._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_190,"test_simple_ggx_fit_ggx.png","");
  brdf_plot::export_png((brdf_plot *)local_138,&local_148,&local_190);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190._M_dataplus._M_p != paVar1) {
    operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
  }
  local_190._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_190,"test_simple_ggx_fit_ltc.png","");
  brdf_plot::export_png((brdf_plot *)local_138,(brdf *)local_90,&local_190);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190._M_dataplus._M_p != paVar1) {
    operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
  }
  poVar3 = log_info();
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,"VISUAL TEST: test_simple_ggx_fit completed.",0x2b);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  return;
}

Assistant:

void test_simple_ggx_fit()
{
    log_info() << "VISUAL TEST: test_simple_ggx_fit started." << std::endl;

    ggx ggx;
    ggx.set_alpha(0.15f);

    auto view_dir = glm::normalize(glm::vec3{0.0f, 0.0f, 1.0f});

    auto average_direction = calculate_average_terms(ggx, view_dir).average_direction;
    log_info() << " average direction: " << glm::to_string(average_direction) << std::endl;

    glm::vec3 first_guess = glm::vec3{1.0f, 1.0f, 0.0f};
    glm::vec3 next_guess;
    auto data = ltc_fit(ggx, view_dir, true, first_guess, next_guess);

    log_info() << "Store data:" << std::endl;
    log_info() << " a=" << data.matrix_parameters[0] << std::endl;
    log_info() << " b=" << data.matrix_parameters[1] << std::endl;
    log_info() << " c=" << data.matrix_parameters[2] << std::endl;
    log_info() << " d=" << data.matrix_parameters[3] << std::endl;
    log_info() << " e=" << data.matrix_parameters[4] << std::endl;
    log_info() << " fresnel=" << data.fresnel_term << std::endl;
    log_info() << " magnitude=" << data.distribution_norm << std::endl;

    ltc ltc;
    ltc.set_store_data(data);

    brdf_plot plot;
    plot.set_view_dir(view_dir);
    plot.set_resolution(512);
    plot.export_png(&ggx, "test_simple_ggx_fit_ggx.png");
    plot.export_png(&ltc, "test_simple_ggx_fit_ltc.png");

    log_info() << "VISUAL TEST: test_simple_ggx_fit completed." << std::endl;
}